

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O1

void __thiscall daw::curl_wrapper::curl_wrapper(curl_wrapper *this)

{
  _Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false> _Var1;
  unique_ptr<void,_daw::cw_details::curl_deleter> uVar2;
  
  _Var1._M_head_impl = (impl_t *)operator_new(0x38);
  (_Var1._M_head_impl)->headers =
       (unique_ptr<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>)0x0;
  ((_Var1._M_head_impl)->body)._M_dataplus = (pointer)0x0;
  *(size_type *)((long)&(_Var1._M_head_impl)->body + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->body + 0x10))->_M_allocated_capacity = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->body + 0x18) = 0;
  ((_Var1._M_head_impl)->curl)._M_t =
       (__uniq_ptr_data<void,_daw::cw_details::curl_deleter,_true,_true>)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->has_body = 0;
  ((_Var1._M_head_impl)->body)._M_dataplus = (pointer)((long)&(_Var1._M_head_impl)->body + 0x10);
  *(size_type *)((long)&(_Var1._M_head_impl)->body + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->body + 0x10))->_M_local_buf[0] = '\0';
  uVar2._M_t.super___uniq_ptr_impl<void,_daw::cw_details::curl_deleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_daw::cw_details::curl_deleter>.super__Head_base<0UL,_void_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<void,_daw::cw_details::curl_deleter,_true,_true>)
       cw_details::anon_unknown_0::init_curl();
  ((_Var1._M_head_impl)->curl)._M_t =
       uVar2._M_t.super___uniq_ptr_impl<void,_daw::cw_details::curl_deleter>._M_t.
       super__Tuple_impl<0UL,_void_*,_daw::cw_details::curl_deleter>.
       super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->has_body = false;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
  .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

curl_wrapper::curl_wrapper( )
	  : m_impl( std::make_unique<impl_t>( ) ) {}